

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::update(QLayout *this)

{
  QLayoutPrivate *pQVar1;
  QObject *pQVar2;
  QEvent *this_00;
  QObject *in_RDI;
  bool bVar3;
  QWidget *mw;
  QLayout *layout;
  QObject *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (local_10 != (QObject *)0x0) {
      pQVar1 = d_func((QLayout *)0x33cf9f);
      bVar3 = ((byte)pQVar1->field_0x8c >> 2 & 1) != 0;
    }
    if (!bVar3) break;
    pQVar1 = d_func((QLayout *)0x33cfce);
    pQVar1->field_0x8c = pQVar1->field_0x8c & 0xfb;
    pQVar1 = d_func((QLayout *)0x33cfea);
    if ((pQVar1->field_0x8c & 1) != 0) {
      pQVar2 = QObject::parent((QObject *)0x33d004);
      this_00 = (QEvent *)operator_new(0x10);
      QEvent::QEvent(this_00,LayoutRequest);
      QCoreApplication::postEvent(pQVar2,this_00,0);
      return;
    }
    local_10 = QObject::parent((QObject *)0x33d04c);
  }
  return;
}

Assistant:

void QLayout::update()
{
    QLayout *layout = this;
    while (layout && layout->d_func()->activated) {
        layout->d_func()->activated = false;
        if (layout->d_func()->topLevel) {
            Q_ASSERT(layout->parent()->isWidgetType());
            QWidget *mw = static_cast<QWidget*>(layout->parent());
            QCoreApplication::postEvent(mw, new QEvent(QEvent::LayoutRequest));
            break;
        }
        layout = static_cast<QLayout*>(layout->parent());
    }
}